

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Own<const_kj::File> __thiscall kj::Directory::openFile(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  undefined4 in_register_0000000c;
  int line;
  File *extraout_RDX;
  File *pFVar1;
  ulong in_R8;
  char *macroArgs;
  char *params;
  Own<kj::File> OVar2;
  Own<const_kj::File> OVar3;
  Fault f;
  _func_int **pp_Stack_30;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x68))(&f);
  if (pp_Stack_30 != (_func_int **)0x0) {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Stack_30;
    pFVar1 = extraout_RDX;
    goto LAB_00343d0a;
  }
  if ((in_R8 & 1) == 0) {
    if ((in_R8 & 2) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x246,FAILED,(char *)0x0,
                 "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                 (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                 &path_local);
    }
    else {
      params = "file does not exist";
      macroArgs = "\"file does not exist\", path";
      line = 0x244;
LAB_00343ca8:
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,line,FAILED,(char *)0x0,macroArgs,(char (*) [20])params,&path_local);
    }
  }
  else {
    if ((in_R8 & 2) == 0) {
      params = "file already exists";
      macroArgs = "\"file already exists\", path";
      line = 0x242;
      goto LAB_00343ca8;
    }
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x249,FAILED,(char *)0x0,
               "\"tryOpenFile() returned null despite no preconditions\", path",
               (char (*) [53])"tryOpenFile() returned null despite no preconditions",&path_local);
  }
  _::Debug::Fault::~Fault(&f);
  clock = nullClock();
  OVar2 = newInMemoryFile((kj *)&f,clock);
  pFVar1 = OVar2.ptr;
  (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
  this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
LAB_00343d0a:
  OVar3.ptr = pFVar1;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const File> Directory::openFile(PathPtr path, WriteMode mode) const {
  KJ_IF_MAYBE(f, tryOpenFile(path, mode)) {
    return kj::mv(*f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenFile() returned null despite no preconditions", path) { break; }